

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  bool bVar4;
  pointer ppTVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  pointer ppEVar10;
  long lVar11;
  byte bVar12;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar13;
  timeval now;
  timeval local_58;
  uint local_48;
  int local_44;
  undefined8 local_40;
  long local_38;
  undefined8 uVar14;
  
  if (g_init_gtest_count == 0) {
    puts(
        "\nThis test program did NOT call ::testing::InitGoogleTest before calling RUN_ALL_TESTS().  Please fix it."
        );
    bVar12 = 0;
  }
  else {
    bVar12 = 1;
    if (g_help_flag == '\0') {
      PostFlagParsingInit(this);
      WriteToShardStatusFileIfNeeded();
      pIVar1 = (this->internal_run_death_test_flag_).ptr_;
      bVar4 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                          pIVar1 != (InternalRunDeathTestFlag *)0x0);
      local_44 = FilterTests(this,(uint)!bVar4);
      if (FLAGS_gtest_list_tests == '\x01') {
        ListTestsMatchingFilter(this);
      }
      else {
        iVar6 = 0;
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar6 = FLAGS_gtest_random_seed;
          if (FLAGS_gtest_random_seed == 0) {
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            iVar6 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),8) >> 7) -
                    (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),0xc) >> 0x1f)) +
                    (int)local_58.tv_sec * 1000;
          }
          iVar6 = (iVar6 - 1U) % 99999 + 1;
        }
        this->random_seed_ = iVar6;
        pTVar2 = (this->listeners_).repeater_;
        gettimeofday(&local_58,(__timezone_ptr_t)0x0);
        this->start_timestamp_ =
             local_58.tv_usec / 1000 + CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec) * 1000;
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2);
        uVar8 = 1;
        if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
          uVar8 = FLAGS_gtest_repeat;
        }
        if (uVar8 == 0) {
          bVar12 = 1;
        }
        else {
          uVar9 = 0;
          uVar14 = 0;
          local_48 = uVar8;
          do {
            ppTVar3 = (this->test_cases_).
                      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_40 = uVar14;
            for (ppTVar5 = (this->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar3;
                ppTVar5 = ppTVar5 + 1) {
              TestCase::ClearResult(*ppTVar5);
            }
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            local_38 = CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec);
            lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),8);
            if (local_44 < 1) {
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar9);
            }
            else {
              if (FLAGS_gtest_shuffle == '\x01') {
                (this->random_).state_ = this->random_seed_;
                ShuffleTests(this);
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar9);
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
              ppEVar13 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (ppEVar10 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppEVar10 != ppEVar13;
                  ppEVar10 = ppEVar10 + 1) {
                (**(code **)(*(long *)*ppEVar10 + 0x10))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
              bVar4 = Test::HasFatalFailure();
              if ((!bVar4) &&
                 (ppTVar5 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 0 < (int)((ulong)((long)(this->test_cases_).
                                         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5)
                          >> 3))) {
                lVar11 = 0;
                do {
                  TestCase::Run(ppTVar5[(uint)(this->test_case_indices_).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar11]]);
                  ppTVar5 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar11 = lVar11 + 1;
                } while (lVar11 < (int)((ulong)((long)(this->test_cases_).
                                                                                                            
                                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppTVar5) >> 3));
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xb])
                        (pTVar2,this->parent_);
              ppEVar10 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              for (ppEVar13 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish; ppEVar13 != ppEVar10;
                  ppEVar13 = ppEVar13 + -1) {
                (**(code **)(*(long *)ppEVar13[-1] + 0x18))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2);
            }
            uVar14 = local_40;
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            this->elapsed_time_ =
                 (CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec) - local_38) * 1000 +
                 local_58.tv_usec / 1000 + ((lVar7 >> 7) - (lVar7 >> 0x3f));
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])
                      (pTVar2,this->parent_,uVar9);
            bVar4 = Passed(this);
            UnshuffleTests(this);
            if (FLAGS_gtest_shuffle == '\x01') {
              iVar6 = GetNextRandomSeed(this->random_seed_);
              this->random_seed_ = iVar6;
            }
            bVar12 = (byte)uVar14 | !bVar4;
            uVar14 = CONCAT71((int7)((ulong)uVar14 >> 8),bVar12);
            uVar8 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar8;
          } while (uVar8 != local_48 || (int)local_48 < 0);
          bVar12 = bVar12 ^ 1;
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
      }
    }
  }
  return (bool)(bVar12 & 1);
}

Assistant:

static bool GTestIsInitialized() { return g_init_gtest_count != 0; }